

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::Inserter::insertOne
          (Inserter *this,qsizetype pos,QDockAreaLayoutItem *t)

{
  QDockAreaLayoutItem *in_RDX;
  QDockAreaLayoutItem *in_RSI;
  Inserter *in_RDI;
  QDockAreaLayoutItem *unaff_retaddr;
  qsizetype i;
  long local_20;
  
  setup(in_RDI,(qsizetype)in_RSI,1);
  if (in_RDI->sourceCopyConstruct == 0) {
    QDockAreaLayoutItem::QDockAreaLayoutItem(in_RSI,in_RDX);
    in_RDI->size = in_RDI->size + 1;
    for (local_20 = 0; local_20 != in_RDI->move; local_20 = local_20 + -1) {
      QDockAreaLayoutItem::operator=((QDockAreaLayoutItem *)i,unaff_retaddr);
    }
    QDockAreaLayoutItem::operator=((QDockAreaLayoutItem *)i,unaff_retaddr);
  }
  else {
    QDockAreaLayoutItem::QDockAreaLayoutItem(in_RSI,in_RDX);
    in_RDI->size = in_RDI->size + 1;
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }